

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_A.cpp
# Opt level: O2

void __thiscall A::do_comp(A *this)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  int i;
  int j;
  int iVar4;
  long lVar5;
  int iVar6;
  
  for (i = 0; i < this->n_; i = i + 1) {
    for (iVar4 = 0; iVar4 < this->n_; iVar4 = iVar4 + 1) {
      pfVar1 = this->a;
      pfVar2 = this->b;
      pfVar3 = this->c;
      for (lVar5 = 0; (int)lVar5 < this->n_; lVar5 = lVar5 + 1) {
        iVar6 = this->n_ * i + iVar4;
        pfVar3[iVar6] =
             pfVar1[(long)this->n_ * (long)i + lVar5] * pfVar2[this->n_ * (int)lVar5 + iVar4] +
             pfVar3[iVar6];
      }
    }
  }
  return;
}

Assistant:

void A::do_comp() {
  for(int i = 0; i < n_; i++)
    for(int j = 0; j < n_; j++)
      for(int k = 0; k < n_; k++)
        c[i*n_+j] += a[i*n_+k] * b[k*n_+j];
}